

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O3

spv_result_t
spvOpcodeTableNameLookup
          (spv_target_env env,spv_opcode_table table,char *name,spv_opcode_desc *pEntry)

{
  char *__s;
  spv_result_t sVar1;
  uint32_t uVar2;
  int iVar3;
  size_t __n;
  size_t sVar4;
  ulong uVar5;
  spv_opcode_desc psVar6;
  
  sVar1 = SPV_ERROR_INVALID_POINTER;
  if (pEntry != (spv_opcode_desc *)0x0 && name != (char *)0x0) {
    if (table == (spv_opcode_table)0x0) {
      sVar1 = SPV_ERROR_INVALID_TABLE;
    }
    else {
      __n = strlen(name);
      uVar2 = spvVersionForTargetEnv(env);
      uVar5 = (ulong)table->count;
      sVar1 = SPV_ERROR_INVALID_LOOKUP;
      if (uVar5 != 0) {
        psVar6 = table->entries;
        do {
          if ((((psVar6->minVersion <= uVar2) && (uVar2 <= psVar6->lastVersion)) ||
              (psVar6->numExtensions != 0)) || (psVar6->numCapabilities != 0)) {
            __s = psVar6->name;
            sVar4 = strlen(__s);
            if ((__n == sVar4) && (iVar3 = strncmp(name,__s,__n), iVar3 == 0)) {
              *pEntry = psVar6;
              return SPV_SUCCESS;
            }
          }
          psVar6 = psVar6 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        sVar1 = SPV_ERROR_INVALID_LOOKUP;
      }
    }
  }
  return sVar1;
}

Assistant:

spv_result_t spvOpcodeTableNameLookup(spv_target_env env,
                                      const spv_opcode_table table,
                                      const char* name,
                                      spv_opcode_desc* pEntry) {
  if (!name || !pEntry) return SPV_ERROR_INVALID_POINTER;
  if (!table) return SPV_ERROR_INVALID_TABLE;

  // TODO: This lookup of the Opcode table is suboptimal! Binary sort would be
  // preferable but the table requires sorting on the Opcode name, but it's
  // static const initialized and matches the order of the spec.
  const size_t nameLength = strlen(name);
  const auto version = spvVersionForTargetEnv(env);
  for (uint64_t opcodeIndex = 0; opcodeIndex < table->count; ++opcodeIndex) {
    const spv_opcode_desc_t& entry = table->entries[opcodeIndex];
    // We considers the current opcode as available as long as
    // 1. The target environment satisfies the minimal requirement of the
    //    opcode; or
    // 2. There is at least one extension enabling this opcode.
    //
    // Note that the second rule assumes the extension enabling this instruction
    // is indeed requested in the SPIR-V code; checking that should be
    // validator's work.
    if (((version >= entry.minVersion && version <= entry.lastVersion) ||
         entry.numExtensions > 0u || entry.numCapabilities > 0u) &&
        nameLength == strlen(entry.name) &&
        !strncmp(name, entry.name, nameLength)) {
      // NOTE: Found out Opcode!
      *pEntry = &entry;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}